

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O2

size_t ZSTD_decompressBlock_internal
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,int frame)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  BYTE *pBVar5;
  long lVar6;
  undefined8 uVar7;
  seq_t sequence;
  seq_t sequence_00;
  seq_t sequence_01;
  U32 i;
  BIT_DStream_status BVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  size_t sVar13;
  size_t sVar14;
  long lVar15;
  BYTE *pBVar16;
  ulong uVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  BYTE *pBVar22;
  BYTE *pBVar23;
  BYTE *pBVar24;
  ulong uVar25;
  BYTE *pBVar26;
  seq_t *psVar27;
  U32 nbBits;
  BYTE *oend_1;
  BYTE *pBVar28;
  size_t *psVar29;
  BYTE *oend;
  BYTE *pBVar30;
  ulong uVar31;
  uint uVar32;
  BYTE *oend_2;
  void *srcBuffer;
  size_t sVar33;
  undefined1 *puStackY_220;
  int local_1e4;
  BYTE *local_1e0;
  BYTE *litPtr;
  size_t local_1b0;
  BYTE *local_1a8;
  BYTE *local_1a0;
  seq_t *local_198;
  BYTE *local_190;
  BYTE *local_188;
  BIT_DStream_t local_180;
  ZSTD_fseState local_158;
  ZSTD_fseState local_148;
  ZSTD_fseState local_138;
  size_t local_128 [3];
  BYTE *local_110;
  size_t local_108;
  int local_100;
  int nbSeq;
  seq_t sequences [8];
  
  if (0x1ffff < srcSize) {
    return 0xffffffffffffffb8;
  }
  sVar13 = ZSTD_decodeLiteralsBlock(dctx,src,srcSize);
  if (0xffffffffffffff88 < sVar13) {
    return sVar13;
  }
  iVar9 = dctx->ddictIsCold;
  sVar14 = ZSTD_decodeSeqHeaders(dctx,&nbSeq,(void *)((long)src + sVar13),srcSize - sVar13);
  if (0xffffffffffffff88 < sVar14) {
    return sVar14;
  }
  if (dst == (void *)0x0 && 0 < nbSeq) {
    return 0xffffffffffffffba;
  }
  srcBuffer = (void *)((long)((long)src + sVar13) + sVar14);
  sVar14 = (srcSize - sVar13) - sVar14;
  local_1e4 = nbSeq;
  if (iVar9 == 0) {
    if (frame == 0) {
      if (nbSeq < 9) goto LAB_0055e837;
LAB_0055e16f:
      iVar9 = 0;
      for (uVar10 = 0; bVar19 = (byte)dctx->OFTptr->baseValue, uVar10 >> (bVar19 & 0x1f) == 0;
          uVar10 = uVar10 + 1) {
        iVar9 = (iVar9 + 1) - (uint)(dctx->OFTptr[(ulong)uVar10 + 1].nbAdditionalBits < 0x17);
      }
      dctx->ddictIsCold = 0;
      if (6 < (uint)(iVar9 << (8 - bVar19 & 0x1f))) goto LAB_0055dd29;
    }
    else {
      if (0x1000000 < (dctx->fParams).windowSize && 8 < nbSeq) goto LAB_0055e16f;
LAB_0055e837:
      dctx->ddictIsCold = 0;
    }
    pBVar28 = (BYTE *)(dstCapacity + (long)dst);
    litPtr = dctx->litPtr;
    pBVar24 = litPtr + dctx->litSize;
    local_1e0 = (BYTE *)dst;
    if (nbSeq != 0) {
      pBVar5 = (BYTE *)dctx->prefixStart;
      local_1a8 = (BYTE *)dctx->virtualStart;
      pBVar16 = (BYTE *)dctx->dictEnd;
      dctx->fseEntropy = 1;
      for (lVar15 = -6; lVar15 != 0; lVar15 = lVar15 + 2) {
        *(ulong *)((long)&sequences[4].offset + lVar15 * 4) =
             (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar15 * 2);
      }
      sVar13 = BIT_initDStream((BIT_DStream_t *)sequences,srcBuffer,sVar14);
      if (0xffffffffffffff88 < sVar13) {
        return (size_t)&DAT_ffffffffffffffec;
      }
      ZSTD_initFseState((ZSTD_fseState *)&sequences[1].offset,(BIT_DStream_t *)sequences,
                        dctx->LLTptr);
      ZSTD_initFseState((ZSTD_fseState *)&sequences[2].matchLength,(BIT_DStream_t *)sequences,
                        dctx->OFTptr);
      ZSTD_initFseState((ZSTD_fseState *)(sequences + 3),(BIT_DStream_t *)sequences,dctx->MLTptr);
      local_198 = (seq_t *)(pBVar28 + -0x20);
      do {
        uVar4 = *(ushort *)(sequences[2].litLength + sequences[1].offset * 8);
        bVar19 = *(byte *)(sequences[2].litLength + 2 + sequences[1].offset * 8);
        bVar1 = *(byte *)(sequences[2].litLength + 3 + sequences[1].offset * 8);
        uVar31 = (ulong)*(uint *)(sequences[2].litLength + 4 + sequences[1].offset * 8);
        pBVar26 = (BYTE *)(ulong)*(ushort *)(sequences[3].matchLength + sequences[3].litLength * 8);
        bVar21 = *(byte *)(sequences[3].matchLength + 2 + sequences[3].litLength * 8);
        bVar2 = *(byte *)(sequences[3].matchLength + 3 + sequences[3].litLength * 8);
        uVar25 = (ulong)*(uint *)(sequences[3].matchLength + 4 + sequences[3].litLength * 8);
        pBVar30 = (BYTE *)(ulong)*(ushort *)(sequences[2].offset + sequences[2].matchLength * 8);
        bVar3 = *(byte *)(sequences[2].offset + 2 + sequences[2].matchLength * 8);
        bVar18 = *(byte *)(sequences[2].offset + 3 + sequences[2].matchLength * 8);
        uVar10 = *(uint *)(sequences[2].offset + 4 + sequences[2].matchLength * 8);
        bVar20 = (byte)(int)sequences[0].matchLength;
        if (bVar3 < 2) {
          if (bVar3 != 0) {
            sequences[0].matchLength._0_4_ = (int)sequences[0].matchLength + 1;
            lVar15 = (ulong)(uVar10 + (uVar31 == 0)) -
                     ((long)(sequences[0].litLength << (bVar20 & 0x3f)) >> 0x3f);
            if (lVar15 == 3) {
              sVar13 = (sequences[3].offset - 1) + (ulong)(sequences[3].offset == 1);
            }
            else {
              lVar6 = *(long *)((long)sequences + lVar15 * 8 + 0x58);
              sVar13 = lVar6 + (ulong)(lVar6 == 0);
              if (lVar15 == 1) goto LAB_0055ea35;
            }
            sequences[4].matchLength = sequences[4].litLength;
            goto LAB_0055ea35;
          }
          sVar13 = sequences[4].litLength;
          if (uVar31 == 0) goto LAB_0055ea35;
        }
        else {
          sequences[0].matchLength._0_4_ = (int)sequences[0].matchLength + (uint)bVar3;
          sequences[4].matchLength = sequences[4].litLength;
          sVar13 = ((sequences[0].litLength << (bVar20 & 0x3f)) >> (-bVar3 & 0x3f)) + (ulong)uVar10;
LAB_0055ea35:
          sequences[4].litLength = sequences[3].offset;
          sequences[3].offset = sVar13;
        }
        sVar13 = sequences[3].offset;
        if (bVar21 != 0) {
          bVar20 = (byte)(int)sequences[0].matchLength;
          sequences[0].matchLength._0_4_ = (int)sequences[0].matchLength + (uint)bVar21;
          uVar25 = uVar25 + ((sequences[0].litLength << (bVar20 & 0x3f)) >> (-bVar21 & 0x3f));
        }
        uVar10 = (uint)bVar2;
        uVar12 = (uint)bVar18;
        if (0x1e < (byte)(bVar21 + bVar19 + bVar3)) {
          local_1b0 = CONCAT44(local_1b0._4_4_,(uint)bVar18);
          local_190 = (BYTE *)CONCAT44(local_190._4_4_,(uint)bVar2);
          local_1a0 = pBVar30;
          local_188 = pBVar26;
          BIT_reloadDStream((BIT_DStream_t *)sequences);
          pBVar30 = local_1a0;
          pBVar26 = local_188;
          uVar10 = (uint)local_190;
          uVar12 = (uint)local_1b0;
        }
        if (bVar19 != 0) {
          bVar21 = (byte)(int)sequences[0].matchLength;
          sequences[0].matchLength._0_4_ = (int)sequences[0].matchLength + (uint)bVar19;
          uVar31 = uVar31 + ((sequences[0].litLength << (bVar21 & 0x3f)) >> (-bVar19 & 0x3f));
        }
        uVar32 = (uint)bVar1;
        iVar9 = (int)sequences[0].matchLength + uVar32;
        sequences[1].offset =
             (ulong)((uint)(sequences[0].litLength >> (-(char)iVar9 & 0x3fU)) & BIT_mask[uVar32]) +
             (ulong)uVar4;
        iVar9 = iVar9 + uVar10;
        sequences[3].litLength =
             (size_t)(pBVar26 +
                     ((uint)(sequences[0].litLength >> (-(char)iVar9 & 0x3fU)) & BIT_mask[uVar10]));
        sequences[0].matchLength._0_4_ = iVar9 + uVar12;
        sequences[2].matchLength =
             (size_t)(pBVar30 +
                     ((uint)(sequences[0].litLength >>
                            (-(char)(int)sequences[0].matchLength & 0x3fU)) & BIT_mask[uVar12]));
        pBVar30 = litPtr + uVar31;
        local_180.bitContainer = uVar31;
        local_180._8_8_ = uVar25;
        local_180.ptr = (char *)sVar13;
        if ((pBVar24 < pBVar30) ||
           (uVar17 = uVar31 + uVar25, local_198 < (seq_t *)(local_1e0 + uVar17))) {
          sequence_00.matchLength = uVar25;
          sequence_00.litLength = uVar31;
          sequence_00.offset = sVar13;
          uVar17 = ZSTD_execSequenceEnd
                             (local_1e0,pBVar28,sequence_00,&litPtr,pBVar24,pBVar5,local_1a8,pBVar16
                             );
        }
        else {
          pBVar26 = local_1e0 + uVar31;
          uVar7 = *(undefined8 *)(litPtr + 8);
          *(undefined8 *)local_1e0 = *(undefined8 *)litPtr;
          *(undefined8 *)(local_1e0 + 8) = uVar7;
          if (0x10 < uVar31) {
            uVar7 = *(undefined8 *)(litPtr + 0x18);
            *(undefined8 *)(local_1e0 + 0x10) = *(undefined8 *)(litPtr + 0x10);
            *(undefined8 *)(local_1e0 + 0x18) = uVar7;
            if (0x10 < (long)(uVar31 - 0x10)) {
              lVar15 = 0;
              do {
                uVar7 = *(undefined8 *)(litPtr + lVar15 + 0x20 + 8);
                pBVar22 = local_1e0 + lVar15 + 0x20;
                *(undefined8 *)pBVar22 = *(undefined8 *)(litPtr + lVar15 + 0x20);
                *(undefined8 *)(pBVar22 + 8) = uVar7;
                uVar7 = *(undefined8 *)(litPtr + lVar15 + 0x30 + 8);
                *(undefined8 *)(pBVar22 + 0x10) = *(undefined8 *)(litPtr + lVar15 + 0x30);
                *(undefined8 *)(pBVar22 + 0x18) = uVar7;
                lVar15 = lVar15 + 0x20;
              } while (pBVar22 + 0x20 < pBVar26);
            }
          }
          pBVar22 = pBVar26 + -sVar13;
          litPtr = pBVar30;
          if ((ulong)((long)pBVar26 - (long)pBVar5) < sVar13) {
            if ((ulong)((long)pBVar26 - (long)local_1a8) < sVar13) goto LAB_0055eeb3;
            lVar15 = (long)(pBVar26 + -sVar13) - (long)pBVar5;
            pBVar30 = pBVar16 + lVar15;
            if (pBVar30 + uVar25 <= pBVar16) {
              memmove(pBVar26,pBVar30,uVar25);
              goto LAB_0055ec3a;
            }
            memmove(pBVar26,pBVar30,-lVar15);
            pBVar26 = pBVar26 + -lVar15;
            uVar25 = uVar25 + lVar15;
            pBVar22 = pBVar5;
          }
          local_180._8_8_ = uVar25;
          if (sVar13 < 0x10) {
            if (sVar13 < 8) {
              iVar9 = *(int *)(ZSTD_overlapCopy8_dec64table + sVar13 * 4);
              *pBVar26 = *pBVar22;
              pBVar26[1] = pBVar22[1];
              pBVar26[2] = pBVar22[2];
              pBVar26[3] = pBVar22[3];
              pBVar30 = pBVar22 + *(uint *)(ZSTD_overlapCopy8_dec32table + sVar13 * 4);
              pBVar22 = pBVar22 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + sVar13 * 4) -
                                  (long)iVar9);
              *(undefined4 *)(pBVar26 + 4) = *(undefined4 *)pBVar30;
            }
            else {
              *(undefined8 *)pBVar26 = *(undefined8 *)pBVar22;
            }
            if (8 < uVar25) {
              pBVar30 = pBVar22 + 8;
              pBVar23 = pBVar26 + 8;
              if ((long)pBVar23 - (long)pBVar30 < 0x10) {
                do {
                  *(undefined8 *)pBVar23 = *(undefined8 *)pBVar30;
                  pBVar23 = pBVar23 + 8;
                  pBVar30 = pBVar30 + 8;
                } while (pBVar23 < pBVar26 + uVar25);
              }
              else {
                uVar7 = *(undefined8 *)(pBVar22 + 0x10);
                *(undefined8 *)pBVar23 = *(undefined8 *)pBVar30;
                *(undefined8 *)(pBVar26 + 0x10) = uVar7;
                if (0x18 < (long)uVar25) {
                  lVar15 = 0;
                  do {
                    uVar7 = *(undefined8 *)(pBVar22 + lVar15 + 0x18 + 8);
                    pBVar30 = pBVar26 + lVar15 + 0x18;
                    *(undefined8 *)pBVar30 = *(undefined8 *)(pBVar22 + lVar15 + 0x18);
                    *(undefined8 *)(pBVar30 + 8) = uVar7;
                    uVar7 = *(undefined8 *)(pBVar22 + lVar15 + 0x28 + 8);
                    *(undefined8 *)(pBVar30 + 0x10) = *(undefined8 *)(pBVar22 + lVar15 + 0x28);
                    *(undefined8 *)(pBVar30 + 0x18) = uVar7;
                    lVar15 = lVar15 + 0x20;
                  } while (pBVar30 + 0x20 < pBVar26 + uVar25);
                }
              }
            }
          }
          else {
            uVar7 = *(undefined8 *)(pBVar22 + 8);
            *(undefined8 *)pBVar26 = *(undefined8 *)pBVar22;
            *(undefined8 *)(pBVar26 + 8) = uVar7;
            if (0x10 < (long)uVar25) {
              lVar15 = 0x10;
              do {
                uVar7 = *(undefined8 *)(pBVar22 + lVar15 + 8);
                pBVar30 = pBVar26 + lVar15;
                *(undefined8 *)pBVar30 = *(undefined8 *)(pBVar22 + lVar15);
                *(undefined8 *)(pBVar30 + 8) = uVar7;
                uVar7 = *(undefined8 *)(pBVar22 + lVar15 + 0x10 + 8);
                *(undefined8 *)(pBVar30 + 0x10) = *(undefined8 *)(pBVar22 + lVar15 + 0x10);
                *(undefined8 *)(pBVar30 + 0x18) = uVar7;
                lVar15 = lVar15 + 0x20;
              } while (pBVar30 + 0x20 < pBVar26 + uVar25);
            }
          }
        }
LAB_0055ec3a:
        if (0xffffffffffffff88 < uVar17) {
          return uVar17;
        }
        local_1e0 = local_1e0 + uVar17;
        BVar8 = BIT_reloadDStream((BIT_DStream_t *)sequences);
        local_1e4 = local_1e4 + -1;
      } while (local_1e4 != 0);
      if (BVar8 < BIT_DStream_completed) {
        return (size_t)&DAT_ffffffffffffffec;
      }
      for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
        (dctx->entropy).rep[lVar15] = (U32)(&sequences[3].offset)[lVar15];
      }
    }
    sVar33 = (long)pBVar24 - (long)litPtr;
    if ((ulong)((long)pBVar28 - (long)local_1e0) < sVar33) {
      return 0xffffffffffffffba;
    }
    if (local_1e0 != (BYTE *)0x0) {
      memcpy(local_1e0,litPtr,sVar33);
      local_1e0 = local_1e0 + sVar33;
      goto LAB_0055f29b;
    }
  }
  else {
    dctx->ddictIsCold = 0;
LAB_0055dd29:
    pBVar28 = (BYTE *)(dstCapacity + (long)dst);
    litPtr = dctx->litPtr;
    pBVar24 = litPtr + dctx->litSize;
    local_1e0 = (BYTE *)dst;
    if (nbSeq != 0) {
      pBVar5 = (BYTE *)dctx->prefixStart;
      local_110 = (BYTE *)dctx->virtualStart;
      local_1a0 = (BYTE *)dctx->dictEnd;
      dctx->fseEntropy = 1;
      for (lVar15 = -6; lVar15 != 0; lVar15 = lVar15 + 2) {
        *(ulong *)((long)&local_110 + lVar15 * 4) =
             (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar15 * 2);
      }
      iVar9 = 8;
      if (nbSeq < 8) {
        iVar9 = nbSeq;
      }
      sVar13 = BIT_initDStream(&local_180,srcBuffer,sVar14);
      if (0xffffffffffffff88 < sVar13) {
LAB_0055eeb3:
        puStackY_220 = &DAT_ffffffffffffffec;
        return (size_t)puStackY_220;
      }
      local_188 = pBVar24;
      ZSTD_initFseState(&local_158,&local_180,dctx->LLTptr);
      ZSTD_initFseState(&local_148,&local_180,dctx->OFTptr);
      ZSTD_initFseState(&local_138,&local_180,dctx->MLTptr);
      local_1b0 = (size_t)iVar9;
      psVar29 = &sequences[0].offset;
      local_100 = iVar9;
      for (uVar31 = 0;
          (BVar8 = BIT_reloadDStream(&local_180), BVar8 != BIT_DStream_overflow &&
          ((long)uVar31 < (long)local_1b0)); uVar31 = uVar31 + 1) {
        local_198 = (seq_t *)(ulong)local_158.table[local_158.state].nextState;
        bVar19 = local_158.table[local_158.state].nbAdditionalBits;
        bVar1 = local_158.table[local_158.state].nbBits;
        uVar25 = (ulong)local_158.table[local_158.state].baseValue;
        bVar21 = local_138.table[local_138.state].nbAdditionalBits;
        local_1a8 = (BYTE *)CONCAT44(local_1a8._4_4_,(uint)local_138.table[local_138.state].nbBits);
        sVar13 = (size_t)local_138.table[local_138.state].baseValue;
        bVar2 = local_148.table[local_148.state].nbAdditionalBits;
        bVar3 = local_148.table[local_148.state].nbBits;
        if (bVar2 < 2) {
          if (bVar2 != 0) {
            iVar9 = local_180.bitsConsumed + 1;
            lVar15 = (ulong)(local_148.table[local_148.state].baseValue + (uint)(uVar25 == 0)) -
                     ((long)(local_180.bitContainer << ((byte)local_180.bitsConsumed & 0x3f)) >>
                     0x3f);
            if (lVar15 == 3) {
              sVar14 = (local_128[0] - 1) + (ulong)(local_128[0] == 1);
            }
            else {
              sVar14 = local_128[lVar15] + (ulong)(local_128[lVar15] == 0);
              if (lVar15 == 1) goto LAB_0055df21;
            }
            local_128[2] = local_128[1];
            goto LAB_0055df21;
          }
          if (uVar25 == 0) {
            sVar14 = local_128[0];
            local_128[0] = local_128[1];
            local_128[1] = sVar14;
          }
        }
        else {
          iVar9 = local_180.bitsConsumed + bVar2;
          sVar14 = ((local_180.bitContainer << ((byte)local_180.bitsConsumed & 0x3f)) >>
                   (-bVar2 & 0x3f)) + (ulong)local_148.table[local_148.state].baseValue;
          local_128[2] = local_128[1];
LAB_0055df21:
          local_128[1] = local_128[0];
          local_180.bitsConsumed = iVar9;
          local_128[0] = sVar14;
        }
        sVar14 = local_128[0];
        if (bVar21 != 0) {
          bVar18 = (byte)local_180.bitsConsumed;
          local_180.bitsConsumed = local_180.bitsConsumed + bVar21;
          sVar13 = sVar13 + ((local_180.bitContainer << (bVar18 & 0x3f)) >> (-bVar21 & 0x3f));
        }
        pBVar24 = (BYTE *)(ulong)local_148.table[local_148.state].nextState;
        uVar17 = (ulong)local_138.table[local_138.state].nextState;
        if (0x1e < (byte)(bVar21 + bVar19 + bVar2)) {
          local_190 = (BYTE *)(ulong)local_148.table[local_148.state].nextState;
          local_108 = (ulong)local_138.table[local_138.state].nextState;
          BIT_reloadDStream(&local_180);
          pBVar24 = local_190;
          uVar17 = local_108;
        }
        uVar10 = local_180.bitsConsumed;
        if (bVar19 != 0) {
          uVar10 = local_180.bitsConsumed + bVar19;
          uVar25 = uVar25 + ((local_180.bitContainer << ((byte)local_180.bitsConsumed & 0x3f)) >>
                            (-bVar19 & 0x3f));
        }
        iVar9 = uVar10 + bVar1;
        iVar11 = iVar9 + (int)local_1a8;
        local_158.state =
             (long)&local_198->litLength +
             (ulong)((uint)(local_180.bitContainer >> (-(char)iVar9 & 0x3fU)) &
                    BIT_mask[(uint)bVar1]);
        iVar9 = iVar11 + (uint)bVar3;
        local_138.state =
             ((uint)(local_180.bitContainer >> (-(char)iVar11 & 0x3fU)) &
             BIT_mask[(ulong)local_1a8 & 0xffffffff]) + uVar17;
        local_148.state =
             (size_t)(pBVar24 +
                     ((uint)(local_180.bitContainer >> (-(char)iVar9 & 0x3fU)) &
                     BIT_mask[(uint)bVar3]));
        local_180.bitsConsumed = iVar9;
        ((seq_t *)(psVar29 + -2))->litLength = uVar25;
        psVar29[-1] = sVar13;
        *psVar29 = sVar14;
        psVar29 = psVar29 + 3;
      }
      if ((long)uVar31 < (long)local_1b0) goto LAB_0055eeb3;
      local_190 = pBVar28 + -0x20;
      while( true ) {
        BVar8 = BIT_reloadDStream(&local_180);
        sVar13 = local_128[1];
        uVar10 = (uint)uVar31;
        if ((BVar8 == BIT_DStream_overflow) || (nbSeq <= (int)uVar10)) break;
        uVar4 = local_158.table[local_158.state].nextState;
        bVar19 = local_158.table[local_158.state].nbAdditionalBits;
        bVar1 = local_158.table[local_158.state].nbBits;
        uVar31 = (ulong)local_158.table[local_158.state].baseValue;
        local_1a8 = (BYTE *)(ulong)local_138.table[local_138.state].nextState;
        bVar21 = local_138.table[local_138.state].nbAdditionalBits;
        bVar2 = local_138.table[local_138.state].nbBits;
        sVar14 = (size_t)local_138.table[local_138.state].baseValue;
        local_198 = (seq_t *)(ulong)local_148.table[local_148.state].nextState;
        bVar3 = local_148.table[local_148.state].nbAdditionalBits;
        bVar18 = local_148.table[local_148.state].nbBits;
        bVar20 = (byte)local_180.bitsConsumed;
        if (bVar3 < 2) {
          if (bVar3 == 0) {
            if (uVar31 == 0) {
              local_128[1] = local_128[0];
              local_128[0] = sVar13;
            }
          }
          else {
            local_180.bitsConsumed = local_180.bitsConsumed + 1;
            lVar15 = (ulong)(local_148.table[local_148.state].baseValue + (uint)(uVar31 == 0)) -
                     ((long)(local_180.bitContainer << (bVar20 & 0x3f)) >> 0x3f);
            if (lVar15 == 3) {
              local_1b0 = (local_128[0] - 1) + (ulong)(local_128[0] == 1);
LAB_0055e772:
              local_128[2] = local_128[1];
            }
            else {
              local_1b0 = local_128[lVar15] + (ulong)(local_128[lVar15] == 0);
              if (lVar15 != 1) goto LAB_0055e772;
            }
            local_128[1] = local_128[0];
            local_128[0] = local_1b0;
          }
        }
        else {
          local_180.bitsConsumed = local_180.bitsConsumed + bVar3;
          local_128[1] = local_128[0];
          local_128[2] = sVar13;
          local_128[0] = ((local_180.bitContainer << (bVar20 & 0x3f)) >> (-bVar3 & 0x3f)) +
                         (ulong)local_148.table[local_148.state].baseValue;
        }
        if (bVar21 != 0) {
          bVar20 = (byte)local_180.bitsConsumed;
          local_180.bitsConsumed = local_180.bitsConsumed + bVar21;
          sVar14 = sVar14 + ((local_180.bitContainer << (bVar20 & 0x3f)) >> (-bVar21 & 0x3f));
        }
        local_1b0 = local_128[0];
        if (0x1e < (byte)(bVar21 + bVar19 + bVar3)) {
          local_108 = uVar31;
          BIT_reloadDStream(&local_180);
          uVar31 = local_108;
        }
        uVar12 = local_180.bitsConsumed;
        if (bVar19 != 0) {
          uVar12 = local_180.bitsConsumed + bVar19;
          uVar31 = uVar31 + ((local_180.bitContainer << ((byte)local_180.bitsConsumed & 0x3f)) >>
                            (-bVar19 & 0x3f));
        }
        iVar9 = uVar12 + bVar1;
        iVar11 = iVar9 + (uint)bVar2;
        local_158.state =
             (ulong)((uint)(local_180.bitContainer >> (-(char)iVar9 & 0x3fU)) &
                    BIT_mask[(uint)bVar1]) + (ulong)uVar4;
        iVar9 = iVar11 + (uint)bVar18;
        local_138.state =
             (size_t)(local_1a8 +
                     ((uint)(local_180.bitContainer >> (-(char)iVar11 & 0x3fU)) &
                     BIT_mask[(uint)bVar2]));
        local_148.state =
             (long)&local_198->litLength +
             (ulong)((uint)(local_180.bitContainer >> (-(char)iVar9 & 0x3fU)) &
                    BIT_mask[(uint)bVar18]);
        local_180.bitsConsumed = iVar9;
        uVar12 = uVar10 & 7;
        psVar27 = sequences + uVar12;
        uVar25 = psVar27->litLength;
        pBVar24 = litPtr + uVar25;
        if (local_188 < pBVar24) {
LAB_0055e573:
          sequence.matchLength = sequences[uVar12].matchLength;
          sequence.litLength = psVar27->litLength;
          sequence.offset = sequences[uVar12].offset;
          pBVar16 = (BYTE *)ZSTD_execSequenceEnd
                                      (local_1e0,pBVar28,sequence,&litPtr,local_188,pBVar5,local_110
                                       ,local_1a0);
        }
        else {
          sVar33 = sequences[uVar12].matchLength;
          pBVar16 = (BYTE *)(sVar33 + uVar25);
          if (local_190 < local_1e0 + (long)pBVar16) goto LAB_0055e573;
          uVar17 = sequences[uVar12].offset;
          pBVar30 = local_1e0 + uVar25;
          uVar7 = *(undefined8 *)(litPtr + 8);
          *(undefined8 *)local_1e0 = *(undefined8 *)litPtr;
          *(undefined8 *)(local_1e0 + 8) = uVar7;
          if (0x10 < uVar25) {
            uVar7 = *(undefined8 *)(litPtr + 0x18);
            *(undefined8 *)(local_1e0 + 0x10) = *(undefined8 *)(litPtr + 0x10);
            *(undefined8 *)(local_1e0 + 0x18) = uVar7;
            if (0x10 < (long)(uVar25 - 0x10)) {
              lVar15 = 0;
              do {
                uVar7 = *(undefined8 *)(litPtr + lVar15 + 0x20 + 8);
                pBVar26 = local_1e0 + lVar15 + 0x20;
                *(undefined8 *)pBVar26 = *(undefined8 *)(litPtr + lVar15 + 0x20);
                *(undefined8 *)(pBVar26 + 8) = uVar7;
                uVar7 = *(undefined8 *)(litPtr + lVar15 + 0x30 + 8);
                *(undefined8 *)(pBVar26 + 0x10) = *(undefined8 *)(litPtr + lVar15 + 0x30);
                *(undefined8 *)(pBVar26 + 0x18) = uVar7;
                lVar15 = lVar15 + 0x20;
              } while (pBVar26 + 0x20 < pBVar30);
            }
          }
          pBVar26 = pBVar30 + -uVar17;
          litPtr = pBVar24;
          if ((ulong)((long)pBVar30 - (long)pBVar5) < uVar17) {
            if ((ulong)((long)pBVar30 - (long)local_110) < uVar17) goto LAB_0055eeb3;
            lVar15 = (long)(pBVar30 + -uVar17) - (long)pBVar5;
            pBVar24 = local_1a0 + lVar15;
            local_1a8 = pBVar16;
            local_198 = psVar27;
            if (local_1a0 < pBVar24 + sVar33) {
              memmove(pBVar30,pBVar24,-lVar15);
              pBVar30 = pBVar30 + -lVar15;
              sVar33 = sVar33 + lVar15;
              pBVar16 = local_1a8;
              pBVar26 = pBVar5;
              psVar27 = local_198;
              goto LAB_0055e4a4;
            }
            memmove(pBVar30,pBVar24,sVar33);
            pBVar16 = local_1a8;
            psVar27 = local_198;
          }
          else {
LAB_0055e4a4:
            if (uVar17 < 0x10) {
              if (uVar17 < 8) {
                iVar9 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar17 * 4);
                *pBVar30 = *pBVar26;
                pBVar30[1] = pBVar26[1];
                pBVar30[2] = pBVar26[2];
                pBVar30[3] = pBVar26[3];
                pBVar24 = pBVar26 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar17 * 4);
                pBVar26 = pBVar26 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar17 * 4) -
                                    (long)iVar9);
                *(undefined4 *)(pBVar30 + 4) = *(undefined4 *)pBVar24;
              }
              else {
                *(undefined8 *)pBVar30 = *(undefined8 *)pBVar26;
              }
              if (8 < sVar33) {
                pBVar24 = pBVar26 + 8;
                pBVar22 = pBVar30 + 8;
                if ((long)pBVar22 - (long)pBVar24 < 0x10) {
                  do {
                    *(undefined8 *)pBVar22 = *(undefined8 *)pBVar24;
                    pBVar22 = pBVar22 + 8;
                    pBVar24 = pBVar24 + 8;
                  } while (pBVar22 < pBVar30 + sVar33);
                }
                else {
                  uVar7 = *(undefined8 *)(pBVar26 + 0x10);
                  *(undefined8 *)pBVar22 = *(undefined8 *)pBVar24;
                  *(undefined8 *)(pBVar30 + 0x10) = uVar7;
                  if (0x18 < (long)sVar33) {
                    lVar15 = 0;
                    do {
                      uVar7 = *(undefined8 *)(pBVar26 + lVar15 + 0x18 + 8);
                      pBVar24 = pBVar30 + lVar15 + 0x18;
                      *(undefined8 *)pBVar24 = *(undefined8 *)(pBVar26 + lVar15 + 0x18);
                      *(undefined8 *)(pBVar24 + 8) = uVar7;
                      uVar7 = *(undefined8 *)(pBVar26 + lVar15 + 0x28 + 8);
                      *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)(pBVar26 + lVar15 + 0x28);
                      *(undefined8 *)(pBVar24 + 0x18) = uVar7;
                      lVar15 = lVar15 + 0x20;
                    } while (pBVar24 + 0x20 < pBVar30 + sVar33);
                  }
                }
              }
            }
            else {
              uVar7 = *(undefined8 *)(pBVar26 + 8);
              *(undefined8 *)pBVar30 = *(undefined8 *)pBVar26;
              *(undefined8 *)(pBVar30 + 8) = uVar7;
              if (0x10 < (long)sVar33) {
                lVar15 = 0x10;
                do {
                  uVar7 = *(undefined8 *)(pBVar26 + lVar15 + 8);
                  pBVar24 = pBVar30 + lVar15;
                  *(undefined8 *)pBVar24 = *(undefined8 *)(pBVar26 + lVar15);
                  *(undefined8 *)(pBVar24 + 8) = uVar7;
                  uVar7 = *(undefined8 *)(pBVar26 + lVar15 + 0x10 + 8);
                  *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)(pBVar26 + lVar15 + 0x10);
                  *(undefined8 *)(pBVar24 + 0x18) = uVar7;
                  lVar15 = lVar15 + 0x20;
                } while (pBVar24 + 0x20 < pBVar30 + sVar33);
              }
            }
          }
        }
        if ((BYTE *)0xffffffffffffff88 < pBVar16) {
          return (size_t)pBVar16;
        }
        psVar27->litLength = uVar31;
        psVar27->matchLength = sVar14;
        psVar27->offset = local_1b0;
        local_1e0 = local_1e0 + (long)pBVar16;
        uVar31 = (ulong)(uVar10 + 1);
      }
      if ((int)uVar10 < nbSeq) goto LAB_0055eeb3;
      for (uVar10 = uVar10 - local_100; (int)uVar10 < nbSeq; uVar10 = uVar10 + 1) {
        uVar12 = uVar10 & 7;
        uVar31 = sequences[uVar12].litLength;
        pBVar24 = litPtr + uVar31;
        if (local_188 < pBVar24) {
LAB_0055f090:
          sequence_01.matchLength = sequences[uVar12].matchLength;
          sequence_01.litLength = sequences[uVar12].litLength;
          sequence_01.offset = sequences[uVar12].offset;
          uVar25 = ZSTD_execSequenceEnd
                             (local_1e0,pBVar28,sequence_01,&litPtr,local_188,pBVar5,local_110,
                              local_1a0);
        }
        else {
          sVar33 = sequences[uVar12].matchLength;
          uVar25 = uVar31 + sVar33;
          if (local_190 < local_1e0 + uVar25) goto LAB_0055f090;
          uVar17 = sequences[uVar12].offset;
          pBVar16 = local_1e0 + uVar31;
          uVar7 = *(undefined8 *)(litPtr + 8);
          *(undefined8 *)local_1e0 = *(undefined8 *)litPtr;
          *(undefined8 *)(local_1e0 + 8) = uVar7;
          if (0x10 < uVar31) {
            uVar7 = *(undefined8 *)(litPtr + 0x18);
            *(undefined8 *)(local_1e0 + 0x10) = *(undefined8 *)(litPtr + 0x10);
            *(undefined8 *)(local_1e0 + 0x18) = uVar7;
            if (0x10 < (long)(uVar31 - 0x10)) {
              lVar15 = 0;
              do {
                uVar7 = *(undefined8 *)(litPtr + lVar15 + 0x20 + 8);
                pBVar30 = local_1e0 + lVar15 + 0x20;
                *(undefined8 *)pBVar30 = *(undefined8 *)(litPtr + lVar15 + 0x20);
                *(undefined8 *)(pBVar30 + 8) = uVar7;
                uVar7 = *(undefined8 *)(litPtr + lVar15 + 0x30 + 8);
                *(undefined8 *)(pBVar30 + 0x10) = *(undefined8 *)(litPtr + lVar15 + 0x30);
                *(undefined8 *)(pBVar30 + 0x18) = uVar7;
                lVar15 = lVar15 + 0x20;
              } while (pBVar30 + 0x20 < pBVar16);
            }
          }
          pBVar30 = pBVar16 + -uVar17;
          litPtr = pBVar24;
          if ((ulong)((long)pBVar16 - (long)pBVar5) < uVar17) {
            if ((ulong)((long)pBVar16 - (long)local_110) < uVar17) goto LAB_0055eeb3;
            lVar15 = (long)pBVar30 - (long)pBVar5;
            pBVar24 = local_1a0 + lVar15;
            if (local_1a0 < pBVar24 + sVar33) {
              memmove(pBVar16,pBVar24,-lVar15);
              pBVar16 = pBVar16 + -lVar15;
              sVar33 = sVar33 + lVar15;
              pBVar30 = pBVar5;
              goto LAB_0055effe;
            }
            memmove(pBVar16,pBVar24,sVar33);
          }
          else {
LAB_0055effe:
            if (uVar17 < 0x10) {
              if (uVar17 < 8) {
                iVar9 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar17 * 4);
                *pBVar16 = *pBVar30;
                pBVar16[1] = pBVar30[1];
                pBVar16[2] = pBVar30[2];
                pBVar16[3] = pBVar30[3];
                pBVar24 = pBVar30 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar17 * 4);
                pBVar30 = pBVar30 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar17 * 4) -
                                    (long)iVar9);
                *(undefined4 *)(pBVar16 + 4) = *(undefined4 *)pBVar24;
              }
              else {
                *(undefined8 *)pBVar16 = *(undefined8 *)pBVar30;
              }
              if (8 < sVar33) {
                pBVar24 = pBVar30 + 8;
                pBVar26 = pBVar16 + 8;
                if ((long)pBVar26 - (long)pBVar24 < 0x10) {
                  do {
                    *(undefined8 *)pBVar26 = *(undefined8 *)pBVar24;
                    pBVar26 = pBVar26 + 8;
                    pBVar24 = pBVar24 + 8;
                  } while (pBVar26 < pBVar16 + sVar33);
                }
                else {
                  uVar7 = *(undefined8 *)(pBVar30 + 0x10);
                  *(undefined8 *)pBVar26 = *(undefined8 *)pBVar24;
                  *(undefined8 *)(pBVar16 + 0x10) = uVar7;
                  if (0x18 < (long)sVar33) {
                    lVar15 = 0;
                    do {
                      uVar7 = *(undefined8 *)(pBVar30 + lVar15 + 0x18 + 8);
                      pBVar24 = pBVar16 + lVar15 + 0x18;
                      *(undefined8 *)pBVar24 = *(undefined8 *)(pBVar30 + lVar15 + 0x18);
                      *(undefined8 *)(pBVar24 + 8) = uVar7;
                      uVar7 = *(undefined8 *)(pBVar30 + lVar15 + 0x28 + 8);
                      *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)(pBVar30 + lVar15 + 0x28);
                      *(undefined8 *)(pBVar24 + 0x18) = uVar7;
                      lVar15 = lVar15 + 0x20;
                    } while (pBVar24 + 0x20 < pBVar16 + sVar33);
                  }
                }
              }
            }
            else {
              uVar7 = *(undefined8 *)(pBVar30 + 8);
              *(undefined8 *)pBVar16 = *(undefined8 *)pBVar30;
              *(undefined8 *)(pBVar16 + 8) = uVar7;
              if (0x10 < (long)sVar33) {
                lVar15 = 0x10;
                do {
                  uVar7 = *(undefined8 *)(pBVar30 + lVar15 + 8);
                  pBVar24 = pBVar16 + lVar15;
                  *(undefined8 *)pBVar24 = *(undefined8 *)(pBVar30 + lVar15);
                  *(undefined8 *)(pBVar24 + 8) = uVar7;
                  uVar7 = *(undefined8 *)(pBVar30 + lVar15 + 0x10 + 8);
                  *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)(pBVar30 + lVar15 + 0x10);
                  *(undefined8 *)(pBVar24 + 0x18) = uVar7;
                  lVar15 = lVar15 + 0x20;
                } while (pBVar24 + 0x20 < pBVar16 + sVar33);
              }
            }
          }
        }
        if (0xffffffffffffff88 < uVar25) {
          return uVar25;
        }
        local_1e0 = local_1e0 + uVar25;
      }
      for (lVar15 = 0; pBVar24 = local_188, lVar15 != 3; lVar15 = lVar15 + 1) {
        (dctx->entropy).rep[lVar15] = (U32)local_128[lVar15];
      }
    }
    uVar31 = (long)pBVar24 - (long)litPtr;
    if ((ulong)((long)pBVar28 - (long)local_1e0) < uVar31) {
      return 0xffffffffffffffba;
    }
    if (local_1e0 != (BYTE *)0x0) {
      memcpy(local_1e0,litPtr,uVar31);
      local_1e0 = local_1e0 + uVar31;
      goto LAB_0055f29b;
    }
  }
  local_1e0 = (BYTE *)0x0;
LAB_0055f29b:
  return (size_t)(local_1e0 + -(long)dst);
}

Assistant:

size_t
ZSTD_decompressBlock_internal(ZSTD_DCtx* dctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize, const int frame)
{   /* blockType == blockCompressed */
    const BYTE* ip = (const BYTE*)src;
    /* isLongOffset must be true if there are long offsets.
     * Offsets are long if they are larger than 2^STREAM_ACCUMULATOR_MIN.
     * We don't expect that to be the case in 64-bit mode.
     * In block mode, window size is not known, so we have to be conservative.
     * (note: but it could be evaluated from current-lowLimit)
     */
    ZSTD_longOffset_e const isLongOffset = (ZSTD_longOffset_e)(MEM_32bits() && (!frame || (dctx->fParams.windowSize > (1ULL << STREAM_ACCUMULATOR_MIN))));
    DEBUGLOG(5, "ZSTD_decompressBlock_internal (size : %u)", (U32)srcSize);

    RETURN_ERROR_IF(srcSize >= ZSTD_BLOCKSIZE_MAX, srcSize_wrong, "");

    /* Decode literals section */
    {   size_t const litCSize = ZSTD_decodeLiteralsBlock(dctx, src, srcSize);
        DEBUGLOG(5, "ZSTD_decodeLiteralsBlock : %u", (U32)litCSize);
        if (ZSTD_isError(litCSize)) return litCSize;
        ip += litCSize;
        srcSize -= litCSize;
    }

    /* Build Decoding Tables */
    {
        /* These macros control at build-time which decompressor implementation
         * we use. If neither is defined, we do some inspection and dispatch at
         * runtime.
         */
#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        int usePrefetchDecoder = dctx->ddictIsCold;
#endif
        int nbSeq;
        size_t const seqHSize = ZSTD_decodeSeqHeaders(dctx, &nbSeq, ip, srcSize);
        if (ZSTD_isError(seqHSize)) return seqHSize;
        ip += seqHSize;
        srcSize -= seqHSize;

        RETURN_ERROR_IF(dst == NULL && nbSeq > 0, dstSize_tooSmall, "NULL not handled");

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if ( !usePrefetchDecoder
          && (!frame || (dctx->fParams.windowSize > (1<<24)))
          && (nbSeq>ADVANCED_SEQS) ) {  /* could probably use a larger nbSeq limit */
            U32 const shareLongOffsets = ZSTD_getLongOffsetsShare(dctx->OFTptr);
            U32 const minShare = MEM_64bits() ? 7 : 20; /* heuristic values, correspond to 2.73% and 7.81% */
            usePrefetchDecoder = (shareLongOffsets >= minShare);
        }
#endif

        dctx->ddictIsCold = 0;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if (usePrefetchDecoder)
#endif
#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT
            return ZSTD_decompressSequencesLong(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset, frame);
#endif

#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG
        /* else */
        return ZSTD_decompressSequences(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset, frame);
#endif
    }
}